

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityPrintNumberByStyle(UNITY_INT number,UNITY_DISPLAY_STYLE_T style)

{
  int __c;
  
  if ((style & 0x10) == 0) {
    if ((style & 0x20) != 0) {
      UnityPrintNumberUnsigned(number);
      return;
    }
    putchar(0x30);
    putchar(0x78);
    UnityPrintNumberHex(number,(char)style * '\x02' & 0x1e);
    return;
  }
  if (style != UNITY_DISPLAY_STYLE_CHAR) {
    UnityPrintNumber(number);
    return;
  }
  putchar(0x27);
  if (number - 0x20U < 0x5f) {
    __c = (int)number;
  }
  else {
    putchar(0x5c);
    if (number == 10) {
      __c = 0x6e;
    }
    else {
      if (number != 0xd) {
        putchar(0x78);
        UnityPrintNumberHex(number,'\x02');
        goto LAB_00102df5;
      }
      __c = 0x72;
    }
  }
  putchar(__c);
LAB_00102df5:
  putchar(0x27);
  return;
}

Assistant:

void UnityPrintNumberByStyle(const UNITY_INT number, const UNITY_DISPLAY_STYLE_T style)
{
    if ((style & UNITY_DISPLAY_RANGE_INT) == UNITY_DISPLAY_RANGE_INT)
    {
        if (style == UNITY_DISPLAY_STYLE_CHAR)
        {
            /* printable characters plus CR & LF are printed */
            UNITY_OUTPUT_CHAR('\'');
            if ((number <= 126) && (number >= 32))
            {
                UNITY_OUTPUT_CHAR((int)number);
            }
            /* write escaped carriage returns */
            else if (number == 13)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('r');
            }
            /* write escaped line feeds */
            else if (number == 10)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('n');
            }
            /* unprintable characters are shown as codes */
            else
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('x');
                UnityPrintNumberHex((UNITY_UINT)number, 2);
            }
            UNITY_OUTPUT_CHAR('\'');
        }
        else
        {
            UnityPrintNumber(number);
        }
    }
    else if ((style & UNITY_DISPLAY_RANGE_UINT) == UNITY_DISPLAY_RANGE_UINT)
    {
        UnityPrintNumberUnsigned((UNITY_UINT)number);
    }
    else
    {
        UNITY_OUTPUT_CHAR('0');
        UNITY_OUTPUT_CHAR('x');
        UnityPrintNumberHex((UNITY_UINT)number, (char)((style & 0xF) * 2));
    }
}